

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetCurrentFont(ImFont *font)

{
  ImGuiContext *pIVar1;
  float fVar2;
  float local_28;
  bool local_21;
  ImFontAtlas *atlas;
  ImGuiContext *g;
  ImFont *font_local;
  
  pIVar1 = GImGui;
  local_21 = false;
  if (font != (ImFont *)0x0) {
    local_21 = ImFont::IsLoaded(font);
  }
  if (local_21 == false) {
    __assert_fail("font && font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                  ,0x1856,"void ImGui::SetCurrentFont(ImFont *)");
  }
  if (0.0 < font->Scale) {
    pIVar1->Font = font;
    fVar2 = ImMax<float>(1.0,(pIVar1->IO).FontGlobalScale * pIVar1->Font->FontSize *
                             pIVar1->Font->Scale);
    pIVar1->FontBaseSize = fVar2;
    if (pIVar1->CurrentWindow == (ImGuiWindow *)0x0) {
      local_28 = 0.0;
    }
    else {
      local_28 = ImGuiWindow::CalcFontSize(pIVar1->CurrentWindow);
    }
    pIVar1->FontSize = local_28;
    (pIVar1->DrawListSharedData).TexUvWhitePixel = pIVar1->Font->ContainerAtlas->TexUvWhitePixel;
    (pIVar1->DrawListSharedData).Font = pIVar1->Font;
    (pIVar1->DrawListSharedData).FontSize = pIVar1->FontSize;
    return;
  }
  __assert_fail("font->Scale > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                ,0x1857,"void ImGui::SetCurrentFont(ImFont *)");
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}